

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall QMainWindowLayoutState::saveState(QMainWindowLayoutState *this,QDataStream *stream)

{
  QWidget *this_00;
  long lVar1;
  bool bVar2;
  QLayout *pQVar3;
  QDataStream *pQVar4;
  QList<QDockWidgetGroupWindow_*> *__range1;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  QList<QDockWidgetGroupWindow_*> list;
  QArrayData *local_58;
  long lStack_50;
  long local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDockAreaLayout::saveState(&this->dockAreaLayout,stream);
  local_58 = (QArrayData *)0x0;
  lStack_50 = 0;
  local_48 = 0;
  qt_qFindChildren_helper
            (this->mainWindow,0,0,&QDockWidgetGroupWindow::staticMetaObject,&local_58,0);
  lVar1 = lStack_50;
  if (local_48 != 0) {
    lVar6 = local_48 << 3;
    lVar5 = 0;
    do {
      this_00 = *(QWidget **)(lVar1 + lVar5);
      pQVar3 = QWidget::layout(this_00);
      bVar2 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)&pQVar3[4].super_QLayoutItem);
      if (!bVar2) {
        pQVar4 = (QDataStream *)QDataStream::operator<<(stream,0xfffffff9);
        ::operator<<(pQVar4,&this_00->data->crect);
        pQVar3 = QWidget::layout(this_00);
        QDockAreaLayoutInfo::saveState((QDockAreaLayoutInfo *)&pQVar3[4].super_QLayoutItem,stream);
      }
      lVar5 = lVar5 + 8;
    } while (lVar6 != lVar5);
  }
  QToolBarAreaLayout::saveState(&this->toolBarAreaLayout,stream);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayoutState::saveState(QDataStream &stream) const
{
#if QT_CONFIG(dockwidget)
    dockAreaLayout.saveState(stream);
#if QT_CONFIG(tabbar)
    const QList<QDockWidgetGroupWindow *> floatingTabs =
        mainWindow->findChildren<QDockWidgetGroupWindow *>(Qt::FindDirectChildrenOnly);

    for (QDockWidgetGroupWindow *floating : floatingTabs) {
        if (floating->layoutInfo()->isEmpty())
            continue;
        stream << uchar(QDockAreaLayout::FloatingDockWidgetTabMarker) << floating->geometry();
        floating->layoutInfo()->saveState(stream);
    }
#endif
#endif
#if QT_CONFIG(toolbar)
    toolBarAreaLayout.saveState(stream);
#endif
}